

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O0

void __thiscall
icu_63::UCharsTrie::Iterator::Iterator
          (Iterator *this,UCharsTrie *trie,int32_t maxStringLength,UErrorCode *errorCode)

{
  UBool UVar1;
  UVector32 *this_00;
  UVector32 *local_70;
  ConstChar16Ptr local_50;
  int local_48;
  undefined1 local_41;
  int32_t length;
  UErrorCode *local_28;
  UErrorCode *errorCode_local;
  UCharsTrie *pUStack_18;
  int32_t maxStringLength_local;
  UCharsTrie *trie_local;
  Iterator *this_local;
  
  this->uchars_ = trie->uchars_;
  this->pos_ = trie->pos_;
  this->initialPos_ = trie->pos_;
  this->remainingMatchLength_ = trie->remainingMatchLength_;
  this->initialRemainingMatchLength_ = trie->remainingMatchLength_;
  this->skipValue_ = '\0';
  local_28 = errorCode;
  errorCode_local._4_4_ = maxStringLength;
  pUStack_18 = trie;
  trie_local = (UCharsTrie *)this;
  UnicodeString::UnicodeString(&this->str_);
  this->maxLength_ = errorCode_local._4_4_;
  this->value_ = 0;
  this->stack_ = (UVector32 *)0x0;
  UVar1 = ::U_FAILURE(*local_28);
  if (UVar1 == '\0') {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)trie);
    local_41 = 0;
    local_70 = (UVector32 *)0x0;
    if (this_00 != (UVector32 *)0x0) {
      local_41 = 1;
      _length = this_00;
      UVector32::UVector32(this_00,local_28);
      local_70 = this_00;
    }
    this->stack_ = local_70;
    UVar1 = ::U_FAILURE(*local_28);
    if (UVar1 == '\0') {
      if (this->stack_ == (UVector32 *)0x0) {
        *local_28 = U_MEMORY_ALLOCATION_ERROR;
      }
      else if (-1 < this->remainingMatchLength_) {
        local_48 = this->remainingMatchLength_ + 1;
        if ((0 < this->maxLength_) && (this->maxLength_ < local_48)) {
          local_48 = this->maxLength_;
        }
        ConstChar16Ptr::ConstChar16Ptr(&local_50,this->pos_);
        UnicodeString::append(&this->str_,&local_50,local_48);
        ConstChar16Ptr::~ConstChar16Ptr(&local_50);
        this->pos_ = this->pos_ + local_48;
        this->remainingMatchLength_ = this->remainingMatchLength_ - local_48;
      }
    }
  }
  return;
}

Assistant:

UCharsTrie::Iterator::Iterator(const UCharsTrie &trie, int32_t maxStringLength,
                               UErrorCode &errorCode)
        : uchars_(trie.uchars_), pos_(trie.pos_), initialPos_(trie.pos_),
          remainingMatchLength_(trie.remainingMatchLength_),
          initialRemainingMatchLength_(trie.remainingMatchLength_),
          skipValue_(FALSE),
          maxLength_(maxStringLength), value_(0), stack_(NULL) {
    if(U_FAILURE(errorCode)) {
        return;
    }
    stack_=new UVector32(errorCode);
    if(U_FAILURE(errorCode)) {
        return;
    }
    if(stack_==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Pending linear-match node, append remaining UChars to str_.
        ++length;
        if(maxLength_>0 && length>maxLength_) {
            length=maxLength_;  // This will leave remainingMatchLength>=0 as a signal.
        }
        str_.append(pos_, length);
        pos_+=length;
        remainingMatchLength_-=length;
    }
}